

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O0

void __thiscall FListMenuItemPlayerDisplay::UpdateTranslation(FListMenuItemPlayerDisplay *this)

{
  FPlayerClass *pFVar1;
  uint32 color;
  int iVar2;
  int setnum;
  FPlayerClass *pFVar3;
  FPlayerColorSet *colorset;
  FRemapTablePtr *this_00;
  FRemapTable *table;
  FPlayerSkin *pFVar4;
  int PlayerColorset;
  int PlayerSkin;
  int PlayerColor;
  FListMenuItemPlayerDisplay *this_local;
  
  color = userinfo_t::GetColor((userinfo_t *)((long)consoleplayer * 0x2a0 + 0xd63498));
  iVar2 = userinfo_t::GetSkin((userinfo_t *)((long)consoleplayer * 0x2a0 + 0xd63498));
  setnum = userinfo_t::GetColorSet((userinfo_t *)((long)consoleplayer * 0x2a0 + 0xd63498));
  if (this->mPlayerClass != (FPlayerClass *)0x0) {
    pFVar4 = skins + iVar2;
    pFVar1 = this->mPlayerClass;
    pFVar3 = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,0);
    iVar2 = R_FindSkin(pFVar4->name,(int)((long)pFVar1 - (long)pFVar3 >> 5));
    colorset = PClassPlayerPawn::GetColorSet(this->mPlayerClass->Type,setnum);
    pFVar4 = skins + iVar2;
    this_00 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                        (&translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>,8);
    table = FRemapTablePtr::operator_cast_to_FRemapTable_(this_00);
    R_GetPlayerTranslation(color,colorset,pFVar4,table);
  }
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::UpdateTranslation()
{
	int PlayerColor = players[consoleplayer].userinfo.GetColor();
	int	PlayerSkin = players[consoleplayer].userinfo.GetSkin();
	int PlayerColorset = players[consoleplayer].userinfo.GetColorSet();

	if (mPlayerClass != NULL)
	{
		PlayerSkin = R_FindSkin (skins[PlayerSkin].name, int(mPlayerClass - &PlayerClasses[0]));
		R_GetPlayerTranslation(PlayerColor, mPlayerClass->Type->GetColorSet(PlayerColorset),
			&skins[PlayerSkin], translationtables[TRANSLATION_Players][MAXPLAYERS]);
	}
}